

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

BytePtr stackjit::Runtime::getVirtualFunctionAddress(RawClassRef rawClassRef,int index)

{
  GarbageCollector *this;
  ClassMetadata *pCVar1;
  BytePtr *ppuVar2;
  string *psVar3;
  ExecutionEngine *this_00;
  JitFunction p_Var4;
  JitFunction entryPoint;
  string signature;
  ClassRef classRef;
  JitFunction local_60;
  string local_58;
  ClassRef local_38;
  
  this = VMState::gc(Internal::vmState);
  GarbageCollector::getClassRef(&local_38,this,rawClassRef);
  pCVar1 = ClassType::metadata((ClassType *)local_38.mObjRef.mType);
  ppuVar2 = ClassMetadata::virtualFunctionTable(pCVar1);
  p_Var4 = (JitFunction)ppuVar2[index];
  if (p_Var4 == (JitFunction)0x0) {
    pCVar1 = ClassType::metadata((ClassType *)local_38.mObjRef.mType);
    psVar3 = ClassMetadata::getVirtualFunctionSignature_abi_cxx11_(pCVar1,index);
    std::__cxx11::string::string((string *)&local_58,(string *)psVar3);
    local_60 = (JitFunction)0x0;
    this_00 = VMState::engine(Internal::vmState);
    ExecutionEngine::compileFunction(this_00,&local_58,&local_60);
    p_Var4 = local_60;
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (BytePtr)p_Var4;
}

Assistant:

BytePtr Runtime::getVirtualFunctionAddress(RawClassRef rawClassRef, int index) {
		auto classRef = vmState()->gc().getClassRef(rawClassRef);
		auto classType = static_cast<const ClassType*>(classRef.objRef().type());
		auto funcPtr = classType->metadata()->virtualFunctionTable()[index];

		if (funcPtr != nullptr) {
			return funcPtr;
		} else {
			//Compile
			auto signature = classType->metadata()->getVirtualFunctionSignature(index);
			JitFunction entryPoint = nullptr;
			try {
				vmState()->engine().compileFunction(signature, entryPoint);
			} catch (std::runtime_error& e) {
				std::cout << e.what() << std::endl;
				exit(0);
			}

			return (BytePtr)entryPoint;
		}
	}